

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  long lVar1;
  ImGuiTableColumn *pIVar2;
  
  lVar1 = (long)table->ColumnsCount;
  if (0 < lVar1) {
    pIVar2 = (table->Columns).Data;
    do {
      if ((table->Columns).DataEnd <= pIVar2) {
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                      ,0x216,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      if ((pIVar2->IsEnabled != false) || ((pIVar2->Flags & 4) != 0)) {
        pIVar2->AutoFitQueue = '\x02';
        pIVar2->CannotSkipItemsQueue = '\x01';
      }
      pIVar2 = pIVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_WidthStretch)) // Cannot reset weight of hidden stretch column
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}